

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O2

void GraphTask::initialize(search *sch,size_t *num_actions,options_i *options)

{
  unsigned_long *location;
  typed_option<unsigned_long> *op;
  option_group_definition *poVar1;
  ostream *poVar2;
  float *pfVar3;
  uint *puVar4;
  unsigned_long uVar5;
  size_t k;
  ulong uVar6;
  allocator local_410;
  allocator local_40f;
  allocator local_40e;
  allocator local_40d;
  allocator local_40c;
  allocator local_40b;
  allocator local_40a;
  allocator local_409;
  string local_408 [32];
  string local_3e8;
  string local_3c8 [32];
  string local_3a8;
  string local_388 [32];
  string local_368;
  string local_348 [32];
  string local_328;
  string local_308;
  option_group_definition new_options;
  undefined1 local_2b0 [160];
  undefined1 local_210 [160];
  undefined1 local_170 [160];
  typed_option<unsigned_long> local_d0;
  
  location = (unsigned_long *)operator_new(0xb8);
  memset(location,0,0xb8);
  std::__cxx11::string::string
            ((string *)&local_308,"search graphtask options",(allocator *)&local_d0);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string((string *)&local_328,"search_graph_num_loops",&local_409);
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,&local_328,location);
  op = VW::config::typed_option<unsigned_long>::default_value(&local_d0,2);
  std::__cxx11::string::string(local_348,"how many loops to run [def: 2]",&local_40a);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar1 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (&new_options,op);
  std::__cxx11::string::string((string *)&local_368,"search_graph_no_structure",&local_40b);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_368,(bool *)(location + 3));
  std::__cxx11::string::string(local_388,"turn off edge features",&local_40c);
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar1 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar1,(typed_option<bool> *)local_170);
  std::__cxx11::string::string((string *)&local_3a8,"search_graph_separate_learners",&local_40d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_3a8,(bool *)((long)location + 0x19));
  std::__cxx11::string::string(local_3c8,"use a different learner for each pass",&local_40e);
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar1 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar1,(typed_option<bool> *)local_210);
  std::__cxx11::string::string((string *)&local_3e8,"search_graph_directed",&local_40f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_3e8,(bool *)((long)location + 0x1a));
  std::__cxx11::string::string
            (local_408,"construct features based on directed graph semantics",&local_410);
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar1,(typed_option<bool> *)local_2b0);
  std::__cxx11::string::~string(local_408);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2b0);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string(local_3c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_210);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string(local_388);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_170);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string(local_348);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_d0);
  std::__cxx11::string::~string((string *)&local_328);
  (**options->_vptr_options_i)(options,&new_options);
  *(byte *)(location + 3) = (byte)location[3] ^ 1;
  if (*location < 2) {
    *location = 1;
    *(undefined1 *)((long)location + 0x19) = 0;
  }
  uVar5 = *num_actions;
  location[1] = uVar5;
  location[2] = (uVar5 + 1) * ((ulong)*(byte *)((long)location + 0x1a) + 1);
  poVar2 = std::operator<<((ostream *)&std::cerr,"K=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", numN=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  pfVar3 = calloc_or_throw<float>(location[2]);
  location[0x13] = (unsigned_long)pfVar3;
  puVar4 = calloc_or_throw<unsigned_int>((location[1] + 1) * (location[1] + 1));
  location[0x14] = (unsigned_long)puVar4;
  pfVar3 = calloc_or_throw<float>(location[1] + 1);
  location[0x15] = (unsigned_long)pfVar3;
  uVar5 = location[1];
  *(float *)(location + 0x16) = (float)(uVar5 + 1);
  for (uVar6 = 0; uVar6 <= uVar5; uVar6 = uVar6 + 1) {
    *(undefined4 *)(location[0x15] + uVar6 * 4) = 0x3f800000;
    uVar5 = location[1];
  }
  if (*(bool *)((long)location + 0x19) != false) {
    Search::search::set_num_learners(sch,*location);
  }
  sch->task_data = location;
  Search::search::set_options(sch,0);
  Search::search::set_label_parser(sch,(label_parser *)&COST_SENSITIVE::cs_label,example_is_test);
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& options)
{
  task_data* D = new task_data();

  option_group_definition new_options("search graphtask options");
  new_options
      .add(make_option("search_graph_num_loops", D->num_loops).default_value(2).help("how many loops to run [def: 2]"))
      .add(make_option("search_graph_no_structure", D->use_structure).help("turn off edge features"))
      .add(make_option("search_graph_separate_learners", D->separate_learners)
               .help("use a different learner for each pass"))
      .add(make_option("search_graph_directed", D->directed)
               .help("construct features based on directed graph semantics"));
  options.add_and_parse(new_options);

  D->use_structure = !D->use_structure;

  if (D->num_loops <= 1)
  {
    D->num_loops = 1;
    D->separate_learners = false;
  }

  D->K = num_actions;
  D->numN = (D->directed + 1) * (D->K + 1);
  cerr << "K=" << D->K << ", numN=" << D->numN << endl;
  D->neighbor_predictions = calloc_or_throw<float>(D->numN);

  D->confusion_matrix = calloc_or_throw<uint32_t>((D->K + 1) * (D->K + 1));
  D->true_counts = calloc_or_throw<float>(D->K + 1);
  D->true_counts_total = (float)(D->K + 1);
  for (size_t k = 0; k <= D->K; k++) D->true_counts[k] = 1.;

  if (D->separate_learners)
    sch.set_num_learners(D->num_loops);

  sch.set_task_data<task_data>(D);
  sch.set_options(0);  // Search::AUTO_HAMMING_LOSS
  sch.set_label_parser(COST_SENSITIVE::cs_label, example_is_test);
}